

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O3

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(int),boost::python::detail::def_helper<void(PythonModuleClient::*)(int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,AbstractModuleClient *param_1,char *name,first_type fn,
          def_helper<void_(PythonModuleClient::*)(int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
          *helper,...)

{
  long *in_R9;
  undefined1 local_42;
  undefined1 local_41;
  long *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  detail::
  make_function_aux<void(AbstractModuleClient::*)(int),boost::python::default_call_policies,boost::mpl::vector3<void,AbstractModuleClient&,int>,mpl_::int_<0>>
            ((detail *)&local_40,fn,helper,&local_41,&local_42);
  objects::add_to_namespace((object *)this,name,(object *)&local_40,(char *)in_R9[6]);
  *local_40 = *local_40 + -1;
  if (*local_40 == 0) {
    _Py_Dealloc();
  }
  local_38 = 0;
  uStack_30 = 0;
  detail::
  make_function_aux<void(PythonModuleClient::*)(int),boost::python::default_call_policies,boost::mpl::vector3<void,PythonModuleClient&,int>,mpl_::int_<0>>
            ((detail *)&local_40,*(undefined8 *)*in_R9,((undefined8 *)*in_R9)[1],&local_42,&local_41
            );
  objects::add_to_namespace((object *)this,name,(object *)&local_40);
  *local_40 = *local_40 + -1;
  if (*local_40 == 0) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

inline void def_impl(
        T*
      , char const* name
      , Fn fn
      , Helper const& helper
      , ...
    )
    {
        objects::add_to_namespace(
            *this
          , name
          , make_function(
                fn
              , helper.policies()
              , helper.keywords()
              , detail::get_signature(fn, (T*)0)
            )
          , helper.doc()
        );

        this->def_default(name, fn, helper, mpl::bool_<Helper::has_default_implementation>());
    }